

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetMetricGroupCalculateMetricValues
          (zet_metric_group_handle_t hMetricGroup,zet_metric_group_calculation_type_t type,
          size_t rawDataSize,uint8_t *pRawData,uint32_t *pMetricValueCount,
          zet_typed_value_t *pMetricValues)

{
  zet_pfnMetricGroupCalculateMetricValues_t pfnCalculateMetricValues;
  ze_result_t result;
  zet_typed_value_t *pMetricValues_local;
  uint32_t *pMetricValueCount_local;
  uint8_t *pRawData_local;
  size_t rawDataSize_local;
  zet_metric_group_calculation_type_t type_local;
  zet_metric_group_handle_t hMetricGroup_local;
  
  pfnCalculateMetricValues._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c898 != (code *)0x0) {
    pfnCalculateMetricValues._4_4_ =
         (*DAT_0011c898)(hMetricGroup,type,rawDataSize,pRawData,pMetricValueCount,pMetricValues);
  }
  return pfnCalculateMetricValues._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupCalculateMetricValues(
        zet_metric_group_handle_t hMetricGroup,         ///< [in] handle of the metric group
        zet_metric_group_calculation_type_t type,       ///< [in] calculation type to be applied on raw data
        size_t rawDataSize,                             ///< [in] size in bytes of raw data buffer
        const uint8_t* pRawData,                        ///< [in][range(0, rawDataSize)] buffer of raw data to calculate
        uint32_t* pMetricValueCount,                    ///< [in,out] pointer to number of metric values calculated.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of metric values to be calculated.
                                                        ///< if count is greater than the number available in the raw data buffer,
                                                        ///< then the driver shall update the value with the actual number of
                                                        ///< metric values to be calculated.
        zet_typed_value_t* pMetricValues                ///< [in,out][optional][range(0, *pMetricValueCount)] buffer of calculated metrics.
                                                        ///< if count is less than the number available in the raw data buffer,
                                                        ///< then driver shall only calculate that number of metric values.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCalculateMetricValues = context.zetDdiTable.MetricGroup.pfnCalculateMetricValues;
        if( nullptr != pfnCalculateMetricValues )
        {
            result = pfnCalculateMetricValues( hMetricGroup, type, rawDataSize, pRawData, pMetricValueCount, pMetricValues );
        }
        else
        {
            // generic implementation
        }

        return result;
    }